

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O3

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service)

{
  bool bVar1;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  io::Printer::Print<>(printer,"/**\n");
  local_90._24_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._16_8_ = &local_70;
  local_60._M_p = (pointer)&local_50;
  bVar1 = ServiceDescriptor::GetSourceLocation(service,(SourceLocation *)local_90);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._16_8_ != &local_70) {
    operator_delete((void *)local_90._16_8_);
  }
  EscapeJavadoc((string *)local_90,(string *)(*(long *)(service + 8) + 0x20));
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer," * Protobuf service {@code $fullname$}\n */\n",(char (*) [9])"fullname",
             (string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}